

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void edition_unittest::TestCamelCaseFieldNames::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  _func_int **pp_Var4;
  Arena *in_RCX;
  Arena *pAVar5;
  char *extraout_RDX;
  char *pcVar6;
  uint unaff_EBP;
  MessageLite *pMVar7;
  MessageLite *pMVar8;
  Arena *arena;
  string_view value;
  string_view value_00;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pMVar7 = to_msg;
    pMVar8 = from_msg;
    MergeImpl();
    pcVar6 = extraout_RDX;
LAB_00c30112:
    in_RCX = *(Arena **)((ulong)in_RCX & 0xfffffffffffffffe);
LAB_00c2fffa:
    value._M_str = pcVar6;
    value._M_len = (size_t)pMVar7;
    google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)pMVar8,value,in_RCX);
  }
  else {
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3));
    }
    google::protobuf::RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)&to_msg[4]._internal_metadata_,
               (RepeatedField<int> *)&from_msg[4]._internal_metadata_);
    if ((int)from_msg[6]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 6),(RepeatedPtrFieldBase *)(from_msg + 6),
                 google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>);
    }
    if (*(int *)&from_msg[8]._vptr_MessageLite != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)&to_msg[7]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[7]._internal_metadata_);
    }
    if ((int)from_msg[9]._internal_metadata_.ptr_ != 0) {
      google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                ((RepeatedPtrFieldBase *)(to_msg + 9),(RepeatedPtrFieldBase *)(from_msg + 9));
    }
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 0x3f) == 0) goto LAB_00c300c0;
    if ((unaff_EBP & 1) != 0) {
      puVar3 = (undefined8 *)(from_msg[10]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      pcVar6 = (char *)*puVar3;
      pMVar7 = (MessageLite *)puVar3[1];
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      pMVar8 = (MessageLite *)&to_msg[10]._internal_metadata_;
      in_RCX = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)in_RCX & 1) != 0) goto LAB_00c30112;
      goto LAB_00c2fffa;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    puVar3 = (undefined8 *)((ulong)from_msg[0xb]._vptr_MessageLite & 0xfffffffffffffffc);
    pcVar6 = (char *)*puVar3;
    sVar1 = puVar3[1];
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    value_00._M_str = pcVar6;
    value_00._M_len = sVar1;
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)(to_msg + 0xb),value_00,pAVar5);
  }
  if ((unaff_EBP & 4) != 0) {
    uVar2 = from_msg[0xb]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0xb]._internal_metadata_,
               (string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
  }
  if ((unaff_EBP & 8) != 0) {
    pMVar8 = (MessageLite *)from_msg[0xc]._vptr_MessageLite;
    if (pMVar8 == (MessageLite *)0x0) {
      MergeImpl((TestCamelCaseFieldNames *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[0xc]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var4 = (_func_int **)
                google::protobuf::Arena::CopyConstruct<edition_unittest::ForeignMessage>
                          (arena,pMVar8);
      to_msg[0xc]._vptr_MessageLite = pp_Var4;
    }
    else {
      ForeignMessage::MergeImpl((MessageLite *)to_msg[0xc]._vptr_MessageLite,pMVar8);
    }
  }
  if ((unaff_EBP & 0x10) != 0) {
    *(int *)&to_msg[0xc]._internal_metadata_.ptr_ = (int)from_msg[0xc]._internal_metadata_.ptr_;
  }
  if ((unaff_EBP & 0x20) != 0) {
    *(undefined4 *)((long)&to_msg[0xc]._internal_metadata_.ptr_ + 4) =
         *(undefined4 *)((long)&from_msg[0xc]._internal_metadata_.ptr_ + 4);
  }
LAB_00c300c0:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestCamelCaseFieldNames::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestCamelCaseFieldNames*>(&to_msg);
  auto& from = static_cast<const TestCamelCaseFieldNames&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestCamelCaseFieldNames)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeatedprimitivefield()->MergeFrom(from._internal_repeatedprimitivefield());
  _this->_internal_mutable_repeatedstringfield()->MergeFrom(from._internal_repeatedstringfield());
  _this->_internal_mutable_repeatedenumfield()->MergeFrom(from._internal_repeatedenumfield());
  _this->_internal_mutable_repeatedmessagefield()->MergeFrom(
      from._internal_repeatedmessagefield());
  _this->_internal_mutable_repeatedstringpiecefield()->MergeFrom(from._internal_repeatedstringpiecefield());
  _this->_internal_mutable_repeatedcordfield()->MergeFrom(from._internal_repeatedcordfield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_stringfield(from._internal_stringfield());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_stringpiecefield(from._internal_stringpiecefield());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cordfield(from._internal_cordfield());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.messagefield_ != nullptr);
      if (_this->_impl_.messagefield_ == nullptr) {
        _this->_impl_.messagefield_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.messagefield_);
      } else {
        _this->_impl_.messagefield_->MergeFrom(*from._impl_.messagefield_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.primitivefield_ = from._impl_.primitivefield_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.enumfield_ = from._impl_.enumfield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}